

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestNestedRequiredForeign::_InternalSerialize
          (TestNestedRequiredForeign *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  TestNestedRequiredForeign *value;
  TestRequiredForeign *value_00;
  TestRequiredEnum *value_01;
  TestRequiredEnumNoMask *value_02;
  TestRequiredEnumMulti *value_03;
  TestRequiredNoMaskMulti *value_04;
  bool bVar2;
  int iVar3;
  int32_t value_05;
  uint32_t *puVar4;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  TestNestedRequiredForeign *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestNestedRequiredForeign *this_local;
  
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar4;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    value = (this->field_0)._impl_.child_;
    iVar3 = GetCachedSize((this->field_0)._impl_.child_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (1,(MessageLite *)value,iVar3,target,stream);
  }
  if ((uVar1 & 2) != 0) {
    value_00 = (this->field_0)._impl_.payload_;
    iVar3 = TestRequiredForeign::GetCachedSize((this->field_0)._impl_.payload_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)value_00,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x40) != 0) {
    value_05 = _internal_dummy(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                             (stream,value_05,(uint8_t *)stream_local);
  }
  if ((uVar1 & 4) != 0) {
    value_01 = (this->field_0)._impl_.required_enum_;
    iVar3 = TestRequiredEnum::GetCachedSize((this->field_0)._impl_.required_enum_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (5,(MessageLite *)value_01,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 8) != 0) {
    value_02 = (this->field_0)._impl_.required_enum_no_mask_;
    iVar3 = TestRequiredEnumNoMask::GetCachedSize((this->field_0)._impl_.required_enum_no_mask_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (6,(MessageLite *)value_02,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x10) != 0) {
    value_03 = (this->field_0)._impl_.required_enum_multi_;
    iVar3 = TestRequiredEnumMulti::GetCachedSize((this->field_0)._impl_.required_enum_multi_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (7,(MessageLite *)value_03,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x20) != 0) {
    value_04 = (this->field_0)._impl_.required_no_mask_;
    iVar3 = TestRequiredNoMaskMulti::GetCachedSize((this->field_0)._impl_.required_no_mask_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (9,(MessageLite *)value_04,iVar3,(uint8_t *)stream_local,stream);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedRequiredForeign::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedRequiredForeign& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestNestedRequiredForeign)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .edition_unittest.TestNestedRequiredForeign child = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.child_, this_._impl_.child_->GetCachedSize(), target,
        stream);
  }

  // .edition_unittest.TestRequiredForeign payload = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.payload_, this_._impl_.payload_->GetCachedSize(), target,
        stream);
  }

  // int32 dummy = 3;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_dummy(), target);
  }

  // .edition_unittest.TestRequiredEnum required_enum = 5;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        5, *this_._impl_.required_enum_, this_._impl_.required_enum_->GetCachedSize(), target,
        stream);
  }

  // .edition_unittest.TestRequiredEnumNoMask required_enum_no_mask = 6;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        6, *this_._impl_.required_enum_no_mask_, this_._impl_.required_enum_no_mask_->GetCachedSize(), target,
        stream);
  }

  // .edition_unittest.TestRequiredEnumMulti required_enum_multi = 7;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        7, *this_._impl_.required_enum_multi_, this_._impl_.required_enum_multi_->GetCachedSize(), target,
        stream);
  }

  // .edition_unittest.TestRequiredNoMaskMulti required_no_mask = 9;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        9, *this_._impl_.required_no_mask_, this_._impl_.required_no_mask_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestNestedRequiredForeign)
  return target;
}